

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *
__thiscall
Assimp::FBX::Document::GetConnectionsSequenced
          (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *__return_storage_ptr__,Document *this,uint64_t id,bool is_src,ConnectionMap *conns,
          char **classnames,size_t count)

{
  _Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const> __comp;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_type __n;
  reference ppVar4;
  Element *this_00;
  Token *this_01;
  char *__first;
  char *__last;
  iterator __first_00;
  iterator __last_00;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  pVar5;
  offset_in_Connection_to_subr in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffe90;
  LazyObject *local_138;
  ulong local_d0;
  size_t i_1;
  char *obtype;
  Token *key;
  const_iterator it;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  range;
  ulong local_78;
  size_t i;
  size_t c;
  size_t lengths [6];
  char **classnames_local;
  ConnectionMap *conns_local;
  uint64_t uStack_20;
  bool is_src_local;
  uint64_t id_local;
  Document *this_local;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *temp;
  
  lengths[5] = (size_t)classnames;
  uStack_20 = id;
  id_local = (uint64_t)this;
  this_local = (Document *)__return_storage_ptr__;
  if (classnames == (char **)0x0) {
    __assert_fail("classnames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                  ,0x241,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  if (count == 0) {
    __assert_fail("count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                  ,0x242,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  if (6 < count) {
    __assert_fail("count <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                  ,0x243,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  for (local_78 = 0; local_78 < count; local_78 = local_78 + 1) {
    sVar3 = strlen(*(char **)(lengths[5] + local_78 * 8));
    lengths[local_78 - 1] = sVar3;
  }
  range.second._M_node._7_1_ = 0;
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  vector(__return_storage_ptr__);
  pVar5 = std::
          multimap<unsigned_long,_const_Assimp::FBX::Connection_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
          ::equal_range(conns,&stack0xffffffffffffffe0);
  it._M_node = (_Base_ptr)pVar5.second._M_node;
  range.first._M_node = it._M_node;
  __n = std::
        distance<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
                  (pVar5.first._M_node,
                   (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>
                    )it._M_node);
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  reserve(__return_storage_ptr__,__n);
  key = (Token *)pVar5.first._M_node._M_node;
  do {
    bVar1 = std::operator!=((_Self *)&key,&range.first);
    if (!bVar1) {
      __first_00 = std::
                   vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   ::begin(__return_storage_ptr__);
      __last_00 = std::
                  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ::end(__return_storage_ptr__);
      std::mem_fn<bool(Assimp::FBX::Connection_const*)const,Assimp::FBX::Connection>
                ((_Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const>
                  *)Connection::Compare,0);
      __comp.
      super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
      ._8_8_ = in_stack_fffffffffffffe90;
      __comp.
      super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
      ._M_pmf = in_stack_fffffffffffffe88;
      std::
      sort<__gnu_cxx::__normal_iterator<Assimp::FBX::Connection_const**,std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>>,std::_Mem_fn<bool(Assimp::FBX::Connection::*)(Assimp::FBX::Connection_const*)const>>
                ((__normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                  )__first_00._M_current,
                 (__normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                  )__last_00._M_current,__comp);
      return __return_storage_ptr__;
    }
    if (is_src) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>
                            *)&key);
      local_138 = Connection::LazyDestinationObject(ppVar4->second);
    }
    else {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>
                            *)&key);
      local_138 = Connection::LazySourceObject(ppVar4->second);
    }
    this_00 = LazyObject::GetElement(local_138);
    this_01 = Element::KeyToken(this_00);
    i_1 = (size_t)Token::begin(this_01);
    for (local_d0 = 0; local_d0 < count; local_d0 = local_d0 + 1) {
      if (*(long *)(lengths[5] + local_d0 * 8) == 0) {
        __assert_fail("classnames[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                      ,0x25a,
                      "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                     );
      }
      __first = Token::begin(this_01);
      __last = Token::end(this_01);
      in_stack_fffffffffffffe90 = std::distance<char_const*>(__first,__last);
      if ((in_stack_fffffffffffffe90 == lengths[local_d0 - 1]) &&
         (iVar2 = strncmp(*(char **)(lengths[5] + local_d0 * 8),(char *)i_1,lengths[local_d0 - 1]),
         iVar2 == 0)) {
        i_1 = 0;
        break;
      }
    }
    if (i_1 == 0) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>
                            *)&key);
      std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::push_back(__return_storage_ptr__,&ppVar4->second);
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>
                *)&key);
  } while( true );
}

Assistant:

std::vector<const Connection*> Document::GetConnectionsSequenced(uint64_t id, bool is_src,
    const ConnectionMap& conns,
    const char* const* classnames,
    size_t count) const

{
    ai_assert(classnames);
    ai_assert( count != 0 );
    ai_assert( count <= MAX_CLASSNAMES);

    size_t lengths[MAX_CLASSNAMES];

    const size_t c = count;
    for (size_t i = 0; i < c; ++i) {
        lengths[ i ] = strlen(classnames[i]);
    }

    std::vector<const Connection*> temp;
    const std::pair<ConnectionMap::const_iterator,ConnectionMap::const_iterator> range =
        conns.equal_range(id);

    temp.reserve(std::distance(range.first,range.second));
    for (ConnectionMap::const_iterator it = range.first; it != range.second; ++it) {
        const Token& key = (is_src
            ? (*it).second->LazyDestinationObject()
            : (*it).second->LazySourceObject()
        ).GetElement().KeyToken();

        const char* obtype = key.begin();

        for (size_t i = 0; i < c; ++i) {
            ai_assert(classnames[i]);
            if(static_cast<size_t>(std::distance(key.begin(),key.end())) == lengths[i] && !strncmp(classnames[i],obtype,lengths[i])) {
                obtype = nullptr;
                break;
            }
        }

        if(obtype) {
            continue;
        }

        temp.push_back((*it).second);
    }

    std::sort(temp.begin(), temp.end(), std::mem_fn(&Connection::Compare));
    return temp; // NRVO should handle this
}